

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O2

sbfRequestImpl *
sbfRequestPub_send(sbfRequestPub_conflict pub,void *data,size_t size,sbfRequestPubReplyCb replyCb,
                  void *closure)

{
  sbfRequestTree *psVar1;
  sbfRequestImpl *psVar2;
  sbfRequestImpl *psVar3;
  int iVar4;
  sbfRequestImpl *psVar5;
  sbfRequestImpl *psVar6;
  sbfRequestImpl *psVar7;
  long lVar8;
  sbfRequestTree *psVar9;
  long lVar10;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar11;
  sbfRequestImpl *psVar12;
  sbfRequestImpl *psVar13;
  sbfGuid *psVar14;
  
  if (pub->mPubReady == 0) {
    return (sbfRequestImpl *)0x0;
  }
  iVar4 = 0;
  if (pub->mSubReady == 0) {
    psVar5 = (sbfRequestImpl *)0x0;
  }
  else {
    psVar5 = (sbfRequestImpl *)sbfMemory_calloc(1,0x68);
    psVar5->mPub = pub;
    (psVar5->mRefCount).mRefCount = 1;
    psVar5->mReplyCb = replyCb;
    psVar5->mClosure = closure;
    sbfGuid_increment(&pub->mNext,1);
    psVar14 = &psVar5->mGuid;
    sbfGuid_copy(psVar14,&pub->mNext);
    psVar1 = &pub->mRequests;
    psVar6 = (sbfRequestImpl *)0x0;
    psVar9 = psVar1;
    while (psVar12 = psVar9->rbh_root, psVar12 != (sbfRequestImpl *)0x0) {
      iVar4 = sbfGuid_compare(psVar14,&psVar12->mGuid);
      lVar10 = 0x48;
      if ((-1 < iVar4) && (lVar10 = 0x50, iVar4 == 0)) goto LAB_0010196b;
      psVar6 = psVar12;
      psVar9 = (sbfRequestTree *)((long)(psVar12->mGuid).mParts + lVar10 + -0x10);
    }
    (psVar5->mTreeEntry).rbe_parent = psVar6;
    (psVar5->mTreeEntry).rbe_left = (sbfRequestImpl *)0x0;
    (psVar5->mTreeEntry).rbe_right = (sbfRequestImpl *)0x0;
    (psVar5->mTreeEntry).rbe_color = 1;
    paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
    if (psVar6 != (sbfRequestImpl *)0x0) {
      if (iVar4 < 0) {
        paVar11 = &psVar6->mTreeEntry;
      }
      else {
        paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar6->mTreeEntry).rbe_right;
      }
    }
    paVar11->rbe_left = psVar5;
    psVar12 = psVar5;
    while ((psVar6 != (sbfRequestImpl *)0x0 && ((psVar6->mTreeEntry).rbe_color == 1))) {
      psVar2 = (psVar6->mTreeEntry).rbe_parent;
      psVar13 = (psVar2->mTreeEntry).rbe_left;
      psVar7 = psVar12;
      if (psVar6 == psVar13) {
        psVar3 = (psVar2->mTreeEntry).rbe_right;
        if ((psVar3 != (sbfRequestImpl *)0x0) && ((psVar3->mTreeEntry).rbe_color == 1)) {
          (psVar3->mTreeEntry).rbe_color = 0;
          goto LAB_001017fc;
        }
        psVar3 = (psVar6->mTreeEntry).rbe_right;
        if (psVar3 == psVar12) {
          psVar13 = (psVar3->mTreeEntry).rbe_left;
          (psVar6->mTreeEntry).rbe_right = psVar13;
          if (psVar13 == (sbfRequestImpl *)0x0) {
            (psVar3->mTreeEntry).rbe_parent = psVar2;
            psVar13 = (psVar6->mTreeEntry).rbe_parent;
LAB_001018ef:
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar13->mTreeEntry).rbe_right;
            if (psVar6 == (psVar13->mTreeEntry).rbe_left) {
              paVar11 = &psVar13->mTreeEntry;
            }
          }
          else {
            (psVar13->mTreeEntry).rbe_parent = psVar6;
            psVar13 = (psVar6->mTreeEntry).rbe_parent;
            (psVar3->mTreeEntry).rbe_parent = psVar13;
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
            if (psVar13 != (sbfRequestImpl *)0x0) goto LAB_001018ef;
          }
          paVar11->rbe_left = psVar3;
          (psVar3->mTreeEntry).rbe_left = psVar6;
          (psVar6->mTreeEntry).rbe_parent = psVar3;
          psVar13 = (psVar2->mTreeEntry).rbe_left;
          psVar7 = psVar6;
          psVar6 = psVar12;
        }
        (psVar6->mTreeEntry).rbe_color = 0;
        (psVar2->mTreeEntry).rbe_color = 1;
        psVar6 = (psVar13->mTreeEntry).rbe_right;
        (psVar2->mTreeEntry).rbe_left = psVar6;
        if (psVar6 != (sbfRequestImpl *)0x0) {
          (psVar6->mTreeEntry).rbe_parent = psVar2;
        }
        psVar6 = (psVar2->mTreeEntry).rbe_parent;
        (psVar13->mTreeEntry).rbe_parent = psVar6;
        paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
        if (psVar6 != (sbfRequestImpl *)0x0) {
          paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar6->mTreeEntry).rbe_right;
          if (psVar2 == (psVar6->mTreeEntry).rbe_left) {
            paVar11 = &psVar6->mTreeEntry;
          }
        }
        paVar11->rbe_left = psVar13;
        (psVar13->mTreeEntry).rbe_right = psVar2;
        (psVar2->mTreeEntry).rbe_parent = psVar13;
      }
      else if ((psVar13 == (sbfRequestImpl *)0x0) || ((psVar13->mTreeEntry).rbe_color != 1)) {
        psVar13 = (psVar6->mTreeEntry).rbe_left;
        if (psVar13 == psVar12) {
          psVar7 = (psVar13->mTreeEntry).rbe_right;
          (psVar6->mTreeEntry).rbe_left = psVar7;
          if (psVar7 == (sbfRequestImpl *)0x0) {
            (psVar13->mTreeEntry).rbe_parent = psVar2;
            psVar7 = (psVar6->mTreeEntry).rbe_parent;
LAB_0010187c:
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
            if (psVar6 == (psVar7->mTreeEntry).rbe_left) {
              paVar11 = &psVar7->mTreeEntry;
            }
          }
          else {
            (psVar7->mTreeEntry).rbe_parent = psVar6;
            psVar7 = (psVar6->mTreeEntry).rbe_parent;
            (psVar13->mTreeEntry).rbe_parent = psVar7;
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
            if (psVar7 != (sbfRequestImpl *)0x0) goto LAB_0010187c;
          }
          paVar11->rbe_left = psVar13;
          (psVar13->mTreeEntry).rbe_right = psVar6;
          (psVar6->mTreeEntry).rbe_parent = psVar13;
          psVar7 = psVar6;
          psVar6 = psVar12;
        }
        (psVar6->mTreeEntry).rbe_color = 0;
        (psVar2->mTreeEntry).rbe_color = 1;
        psVar6 = (psVar2->mTreeEntry).rbe_right;
        psVar12 = (psVar6->mTreeEntry).rbe_left;
        (psVar2->mTreeEntry).rbe_right = psVar12;
        if (psVar12 != (sbfRequestImpl *)0x0) {
          (psVar12->mTreeEntry).rbe_parent = psVar2;
        }
        psVar12 = (psVar2->mTreeEntry).rbe_parent;
        (psVar6->mTreeEntry).rbe_parent = psVar12;
        paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
        if (psVar12 != (sbfRequestImpl *)0x0) {
          paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar12->mTreeEntry).rbe_right;
          if (psVar2 == (psVar12->mTreeEntry).rbe_left) {
            paVar11 = &psVar12->mTreeEntry;
          }
        }
        paVar11->rbe_left = psVar6;
        (psVar6->mTreeEntry).rbe_left = psVar2;
        (psVar2->mTreeEntry).rbe_parent = psVar6;
      }
      else {
        (psVar13->mTreeEntry).rbe_color = 0;
LAB_001017fc:
        (psVar6->mTreeEntry).rbe_color = 0;
        (psVar2->mTreeEntry).rbe_color = 1;
        psVar7 = psVar2;
      }
      psVar12 = psVar7;
      psVar6 = (psVar7->mTreeEntry).rbe_parent;
    }
    (psVar1->rbh_root->mTreeEntry).rbe_color = 0;
LAB_0010196b:
    lVar8 = sbfPub_getBuffer(pub->mPub,size + 0x40);
    lVar10 = *(long *)(lVar8 + 8);
    sbfGuid_copy(lVar10,psVar14);
    *(undefined8 *)(lVar10 + 0x30) = 0;
    *(undefined8 *)(lVar10 + 0x38) = 0;
    *(undefined8 *)(lVar10 + 0x20) = 0;
    *(undefined8 *)(lVar10 + 0x28) = 0;
    memcpy((void *)(lVar10 + 0x40),data,size);
    sbfPub_sendBuffer(pub->mPub,lVar8);
  }
  return psVar5;
}

Assistant:

sbfRequest
sbfRequestPub_send (sbfRequestPub pub,
                    void* data,
                    size_t size,
                    sbfRequestPubReplyCb replyCb,
                    void* closure)
{
    sbfRequest        req;
    sbfBuffer         buffer;
    sbfRequestHeader* hdr;

    if (!pub->mPubReady || !pub->mSubReady)
        return NULL;

    req = xcalloc (1, sizeof *req);
    req->mPub = pub;
    sbfRefCount_init (&req->mRefCount, 1);

    req->mReplyCb = replyCb;
    req->mClosure = closure;

    sbfGuid_increment (&pub->mNext, 1);
    sbfGuid_copy (&req->mGuid, &pub->mNext);

    RB_INSERT (sbfRequestTreeImpl, &pub->mRequests, req);

    buffer = sbfPub_getBuffer (pub->mPub, size + sizeof *hdr);

    hdr = sbfBuffer_getData (buffer);
    sbfGuid_copy (&hdr->mGuid, &req->mGuid);
    memset (hdr->mSpace, 0, sizeof hdr->mSpace);

    memcpy (hdr + 1, data, size);
    sbfPub_sendBuffer (pub->mPub, buffer);

    return req;
}